

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall
DLevelScript::DoSetActorProperty(DLevelScript *this,AActor *actor,int property,int value)

{
  player_t *ppVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  int iVar3;
  uint uVar4;
  AActor *pAVar5;
  char *pcVar6;
  long lVar7;
  VMScriptFunction *pVVar8;
  AActor *pAVar9;
  uint uVar10;
  FNameNoInit *this_00;
  
  if (actor == (AActor *)0x0) {
    return;
  }
  switch(property) {
  case 0:
    if (0 < actor->health) {
      ppVar1 = actor->player;
      if (ppVar1 == (player_t *)0x0) {
        actor->health = value;
      }
      else {
        if (ppVar1->playerstate == '\x01') {
          return;
        }
        actor->health = value;
        ppVar1->health = value;
      }
      if (value < 1) {
        pAVar5 = GC::ReadBarrier<AActor>((AActor **)&this->activator);
        pAVar9 = GC::ReadBarrier<AActor>((AActor **)&this->activator);
        UNRECOVERED_JUMPTABLE = (actor->super_DThinker).super_DObject._vptr_DObject[0xf];
        (*UNRECOVERED_JUMPTABLE)(actor,pAVar5,pAVar9,0,UNRECOVERED_JUMPTABLE);
        return;
      }
    }
    break;
  case 1:
    actor->Speed = (double)value * 1.52587890625e-05;
    break;
  case 2:
    pVVar8 = CreateDamageFunction(value);
    actor->Damage = &pVVar8->super_VMFunction;
    break;
  case 3:
    actor->Alpha = (double)value * 1.52587890625e-05;
    break;
  case 4:
    for (lVar7 = 0; lVar7 != 0x38; lVar7 = lVar7 + 4) {
      if (*(int *)((long)LegacyRenderStyleIndices + lVar7) == value) {
        actor->RenderStyle = *(FRenderStyle *)((long)LegacyRenderStyles + lVar7);
        return;
      }
    }
    break;
  case 5:
    pcVar6 = FBehavior::StaticLookupString(value);
    iVar3 = S_FindSound(pcVar6);
    (actor->SeeSound).super_FSoundID.ID = iVar3;
    break;
  case 6:
    pcVar6 = FBehavior::StaticLookupString(value);
    iVar3 = S_FindSound(pcVar6);
    (actor->AttackSound).super_FSoundID.ID = iVar3;
    break;
  case 7:
    pcVar6 = FBehavior::StaticLookupString(value);
    iVar3 = S_FindSound(pcVar6);
    (actor->PainSound).super_FSoundID.ID = iVar3;
    break;
  case 8:
    pcVar6 = FBehavior::StaticLookupString(value);
    iVar3 = S_FindSound(pcVar6);
    (actor->DeathSound).super_FSoundID.ID = iVar3;
    break;
  case 9:
    pcVar6 = FBehavior::StaticLookupString(value);
    iVar3 = S_FindSound(pcVar6);
    (actor->ActiveSound).super_FSoundID.ID = iVar3;
    break;
  case 10:
    uVar4 = (actor->flags).Value;
    if (value == 0) {
      uVar4 = uVar4 & 0xffffffdf;
    }
    else {
      uVar4 = uVar4 | 0x20;
    }
    goto LAB_00484c9f;
  case 0xb:
    uVar4 = (actor->flags2).Value;
    if (value == 0) {
      uVar4 = uVar4 & 0xf7ffffff;
    }
    else {
      uVar4 = uVar4 | 0x8000000;
    }
    (actor->flags2).Value = uVar4;
    break;
  case 0xc:
    bVar2 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      *(double *)&actor[1].super_DThinker.super_DObject.ObjectFlags =
           (double)value * 1.52587890625e-05;
    }
    break;
  case 0xd:
    uVar4 = (actor->flags5).Value;
    if (value == 0) {
      uVar4 = uVar4 & 0xffffff7f;
    }
    else {
      uVar4 = uVar4 | 0x80;
    }
    (actor->flags5).Value = uVar4;
    break;
  case 0xe:
    uVar4 = (actor->flags4).Value;
    if (value == 0) {
      uVar4 = uVar4 & 0xbfffffff;
    }
    else {
      uVar4 = uVar4 | 0x40000000;
    }
    (actor->flags4).Value = uVar4;
    break;
  case 0xf:
    actor->Gravity = (double)value * 1.52587890625e-05;
    break;
  case 0x10:
    uVar4 = (actor->flags).Value;
    if ((uVar4 & 0x8400000) == 0x400000) {
      level.total_monsters = level.total_monsters + -1;
    }
    uVar10 = (uint)(value != 0) << 0x1b;
    (actor->flags).Value = uVar10 | uVar4 & 0xf7ffffff;
    if ((uVar10 | uVar4 & 0x400000) == 0x400000) {
      level.total_monsters = level.total_monsters + 1;
    }
    break;
  case 0x11:
    bVar2 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      *(int *)&actor[1].super_DThinker.super_DObject._vptr_DObject = value;
    }
    break;
  case 0x12:
    uVar4 = (actor->flags).Value;
    if (value == 0) {
      uVar4 = uVar4 & 0xfffdffff;
    }
    else {
      uVar4 = uVar4 | 0x20000;
    }
LAB_00484c9f:
    (actor->flags).Value = uVar4;
    break;
  case 0x13:
    uVar4 = (actor->flags3).Value;
    if (value == 0) {
      uVar4 = uVar4 & 0xfffbffff;
    }
    else {
      uVar4 = uVar4 | 0x40000;
    }
    (actor->flags3).Value = uVar4;
    break;
  case 0x14:
    pcVar6 = FBehavior::StaticLookupString(value);
    this_00 = &actor->Species;
    goto LAB_00484c27;
  case 0x15:
    pcVar6 = FBehavior::StaticLookupString(value);
    AActor::SetTag(actor,pcVar6);
    return;
  case 0x16:
    actor->Score = value;
    break;
  case 0x17:
    uVar4 = (actor->flags6).Value;
    if (value == 0) {
      uVar4 = uVar4 & 0xfffeffff;
    }
    else {
      uVar4 = uVar4 | 0x10000;
    }
    (actor->flags6).Value = uVar4;
    break;
  case 0x18:
    actor->DamageFactor = (double)value * 1.52587890625e-05;
    break;
  case 0x19:
    pAVar5 = SingleActorFromTID(value,(AActor *)0x0);
    DoSetMaster(actor,pAVar5);
    return;
  case 0x1d:
    (actor->Scale).X = (double)value * 1.52587890625e-05;
    break;
  case 0x1e:
    (actor->Scale).Y = (double)value * 1.52587890625e-05;
    break;
  case 0x20:
    actor->Mass = value;
    break;
  case 0x21:
    actor->accuracy = value;
    break;
  case 0x22:
    actor->stamina = value;
    break;
  case 0x25:
    actor->reactiontime = value;
    break;
  case 0x26:
    actor->meleerange = (double)value * 1.52587890625e-05;
    break;
  case 0x27:
    bVar2 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      actor[1].sprev = (AActor **)((double)value * 1.52587890625e-05);
      if (actor->player != (player_t *)0x0) {
        actor->player->viewheight = (double)value * 1.52587890625e-05;
      }
    }
    break;
  case 0x28:
    bVar2 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      actor[1].SpriteAngle.Degrees = (double)value * 1.52587890625e-05;
    }
    break;
  case 0x29:
    AActor::SetShade(actor,value);
    return;
  case 0x2a:
    actor->Friction = (double)value * 1.52587890625e-05;
    break;
  case 0x2b:
    actor->DamageMultiply = (double)value * 1.52587890625e-05;
    break;
  case 0x2c:
    actor->MaxStepHeight = (double)value * 1.52587890625e-05;
    break;
  case 0x2d:
    actor->MaxDropOffHeight = (double)value * 1.52587890625e-05;
    break;
  case 0x2e:
    pcVar6 = FBehavior::StaticLookupString(value);
    this_00 = &actor->DamageType;
LAB_00484c27:
    FNameNoInit::operator=(this_00,pcVar6);
    return;
  }
  return;
}

Assistant:

void DLevelScript::DoSetActorProperty (AActor *actor, int property, int value)
{
	if (actor == NULL)
	{
		return;
	}
	switch (property)
	{
	case APROP_Health:
		// Don't alter the health of dead things.
		if (actor->health <= 0 || (actor->player != NULL && actor->player->playerstate == PST_DEAD))
		{
			break;
		}
		actor->health = value;
		if (actor->player != NULL)
		{
			actor->player->health = value;
		}
		// If the health is set to a non-positive value, properly kill the actor.
		if (value <= 0)
		{
			actor->Die(activator, activator);
		}
		break;

	case APROP_Speed:
		actor->Speed = ACSToDouble(value);
		break;

	case APROP_Damage:
		actor->Damage = CreateDamageFunction(value);
		break;

	case APROP_Alpha:
		actor->Alpha = ACSToDouble(value);
		break;

	case APROP_RenderStyle:
		for(int i=0; LegacyRenderStyleIndices[i] >= 0; i++)
		{
			if (LegacyRenderStyleIndices[i] == value)
			{
				actor->RenderStyle = ERenderStyle(i);
				break;
			}
		}
		break;

	case APROP_Ambush:
		if (value) actor->flags |= MF_AMBUSH; else actor->flags &= ~MF_AMBUSH;
		break;

	case APROP_Dropped:
		if (value) actor->flags |= MF_DROPPED; else actor->flags &= ~MF_DROPPED;
		break;

	case APROP_Invulnerable:
		if (value) actor->flags2 |= MF2_INVULNERABLE; else actor->flags2 &= ~MF2_INVULNERABLE;
		break;

	case APROP_Notarget:
		if (value) actor->flags3 |= MF3_NOTARGET; else actor->flags3 &= ~MF3_NOTARGET;
		break;

	case APROP_Notrigger:
		if (value) actor->flags6 |= MF6_NOTRIGGER; else actor->flags6 &= ~MF6_NOTRIGGER;
		break;

	case APROP_JumpZ:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
			static_cast<APlayerPawn *>(actor)->JumpZ = ACSToDouble(value);
		break; 	// [GRB]

	case APROP_ChaseGoal:
		if (value)
			actor->flags5 |= MF5_CHASEGOAL;
		else
			actor->flags5 &= ~MF5_CHASEGOAL;
		break;

	case APROP_Frightened:
		if (value)
			actor->flags4 |= MF4_FRIGHTENED;
		else
			actor->flags4 &= ~MF4_FRIGHTENED;
		break;

	case APROP_Friendly:
		if (actor->CountsAsKill()) level.total_monsters--;
		if (value)
		{
			actor->flags |= MF_FRIENDLY;
		}
		else
		{
			actor->flags &= ~MF_FRIENDLY;
		}
		if (actor->CountsAsKill()) level.total_monsters++;
		break;


	case APROP_SpawnHealth:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
		{
			static_cast<APlayerPawn *>(actor)->MaxHealth = value;
		}
		break;

	case APROP_Gravity:
		actor->Gravity = ACSToDouble(value);
		break;

	case APROP_SeeSound:
		actor->SeeSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_AttackSound:
		actor->AttackSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_PainSound:
		actor->PainSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_DeathSound:
		actor->DeathSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_ActiveSound:
		actor->ActiveSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_Species:
		actor->Species = FBehavior::StaticLookupString(value);
		break;

	case APROP_Score:
		actor->Score = value;
		break;

	case APROP_NameTag:
		actor->SetTag(FBehavior::StaticLookupString(value));
		break;

	case APROP_DamageFactor:
		actor->DamageFactor = ACSToDouble(value);
		break;

	case APROP_DamageMultiplier:
		actor->DamageMultiply = ACSToDouble(value);
		break;

	case APROP_MasterTID:
		AActor *other;
		other = SingleActorFromTID (value, NULL);
		DoSetMaster (actor, other);
		break;

	case APROP_ScaleX:
		actor->Scale.X = ACSToDouble(value);
		break;

	case APROP_ScaleY:
		actor->Scale.Y = ACSToDouble(value);
		break;

	case APROP_Mass:
		actor->Mass = value;
		break;

	case APROP_Accuracy:
		actor->accuracy = value;
		break;

	case APROP_Stamina:
		actor->stamina = value;
		break;

	case APROP_ReactionTime:
		actor->reactiontime = value;
		break;

	case APROP_MeleeRange:
		actor->meleerange = ACSToDouble(value);
		break;

	case APROP_ViewHeight:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
		{
			static_cast<APlayerPawn *>(actor)->ViewHeight = ACSToDouble(value);
			if (actor->player != NULL)
			{
				actor->player->viewheight = ACSToDouble(value);
			}
		}
		break;

	case APROP_AttackZOffset:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
			static_cast<APlayerPawn *>(actor)->AttackZOffset = ACSToDouble(value);
		break;

	case APROP_StencilColor:
		actor->SetShade(value);
		break;

	case APROP_Friction:
		actor->Friction = ACSToDouble(value);
		break;

	case APROP_MaxStepHeight:
		actor->MaxStepHeight = ACSToDouble(value);
		break;

	case APROP_MaxDropOffHeight:
		actor->MaxDropOffHeight = ACSToDouble(value);
		break;

	case APROP_DamageType:
		actor->DamageType = FBehavior::StaticLookupString(value);
		break;

	default:
		// do nothing.
		break;
	}
}